

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountedObject.cpp
# Opt level: O1

List * __thiscall
jbcoin::CountedObjects::getCounts_abi_cxx11_
          (List *__return_storage_ptr__,CountedObjects *this,int minimumThreshold)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  int iVar3;
  undefined4 extraout_var;
  __pointer_type pCVar4;
  Entry entry;
  value_type local_58;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::reserve(__return_storage_ptr__,(long)(this->m_count).super___atomic_base<int>._M_i);
  pCVar4 = (this->m_head)._M_b._M_p;
  if (pCVar4 != (__pointer_type)0x0) {
    paVar1 = &local_58.first.field_2;
    do {
      if (minimumThreshold <= (pCVar4->m_count).super___atomic_base<int>._M_i) {
        local_58.first._M_string_length = 0;
        local_58.first.field_2._M_local_buf[0] = '\0';
        local_58.second = 0;
        local_58.first._M_dataplus._M_p = (pointer)paVar1;
        iVar3 = (*pCVar4->_vptr_CounterBase[2])(pCVar4);
        sVar2 = local_58.first._M_string_length;
        strlen((char *)CONCAT44(extraout_var,iVar3));
        std::__cxx11::string::_M_replace
                  ((ulong)&local_58,0,(char *)sVar2,CONCAT44(extraout_var,iVar3));
        local_58.second = (pCVar4->m_count).super___atomic_base<int>._M_i;
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
        ::push_back(__return_storage_ptr__,&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58.first._M_dataplus._M_p != paVar1) {
          operator_delete(local_58.first._M_dataplus._M_p,
                          CONCAT71(local_58.first.field_2._M_allocated_capacity._1_7_,
                                   local_58.first.field_2._M_local_buf[0]) + 1);
        }
      }
      pCVar4 = pCVar4->m_next;
    } while (pCVar4 != (CounterBase *)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

CountedObjects::List CountedObjects::getCounts (int minimumThreshold) const
{
    List counts;

    // When other operations are concurrent, the count
    // might be temporarily less than the actual count.
    int const count = m_count.load ();

    counts.reserve (count);

    CounterBase* counter = m_head.load ();

    while (counter != nullptr)
    {
        if (counter->getCount () >= minimumThreshold)
        {
            Entry entry;

            entry.first = counter->getName ();
            entry.second = counter->getCount ();

            counts.push_back (entry);
        }

        counter = counter->getNext ();
    }

    return counts;
}